

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeViewPrivate::clearConnections(QTreeViewPrivate *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    QObject::disconnect((Connection *)((long)&(this->modelConnections)._M_elems[0].d_ptr + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  lVar1 = 0;
  do {
    QObject::disconnect((Connection *)((long)&(this->headerConnections)._M_elems[0].d_ptr + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x28);
  QObject::disconnect(&this->selectionmodelConnection);
  QObject::disconnect(&this->sortHeaderConnection);
  QObject::disconnect(&this->animationConnection);
  return;
}

Assistant:

void QTreeViewPrivate::clearConnections()
{
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : headerConnections)
        QObject::disconnect(connection);
    QObject::disconnect(selectionmodelConnection);
    QObject::disconnect(sortHeaderConnection);
#if QT_CONFIG(animation)
    QObject::disconnect(animationConnection);
#endif
}